

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval_heap.hpp
# Opt level: O0

bool boost::heap::
     is_interval_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
               (int *first,int *last)

{
  bool bVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30 [2];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  local_20._M_current = last;
  last_local._M_current = first;
  local_30[0] = is_interval_heap_until<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                          (first,last);
  bVar1 = __gnu_cxx::operator==(local_30,&local_20);
  return bVar1;
}

Assistant:

bool is_interval_heap (Iterator first, Iterator last, Compare compare) {
  try {
    return (is_interval_heap_until<Iterator,Compare>(first, last, compare)
            == last);
  } catch (...) {
    return false;
  }
}